

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.h
# Opt level: O0

bool dgrminer::operator<(anomaly_pattern_with_occurrences *lhs,anomaly_pattern_with_occurrences *rhs
                        )

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  ulong uStack_28;
  bool intermediate_res;
  size_t i;
  anomaly_pattern_with_occurrences *rhs_local;
  anomaly_pattern_with_occurrences *lhs_local;
  
  uStack_28 = 0;
  while( true ) {
    sVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                      (&lhs->minimum_code);
    if (sVar2 <= uStack_28) {
      return false;
    }
    pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       (&lhs->minimum_code,uStack_28);
    pvVar4 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       (&rhs->minimum_code,uStack_28);
    bVar1 = is_pattern_edge_smaller_than(pvVar3,pvVar4,true);
    if (bVar1) break;
    pvVar3 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       (&lhs->minimum_code,uStack_28);
    pvVar4 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       (&rhs->minimum_code,uStack_28);
    bVar1 = is_pattern_edge_equal_to(pvVar3,pvVar4,true);
    if (!bVar1) {
      return false;
    }
    uStack_28 = uStack_28 + 1;
  }
  return true;
}

Assistant:

inline bool operator<(const anomaly_pattern_with_occurrences& lhs, const anomaly_pattern_with_occurrences& rhs)
    {
        // (ignoring edge id)
        //return is_pattern_edge_smaller_than(lhs.elements, rhs.elements, true);
        for (size_t i = 0; i < lhs.minimum_code.size(); i++)
        {
            bool intermediate_res = is_pattern_edge_smaller_than(lhs.minimum_code[i], rhs.minimum_code[i], true);
            if (intermediate_res)
            {
                return true;
            }
            else
            {
                intermediate_res = is_pattern_edge_equal_to(lhs.minimum_code[i], rhs.minimum_code[i], true);
                if (!intermediate_res)
                {
                    return false;
                }
            }
        }
        return false;
    }